

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

uint ReadCharFromStream(StreamIn *in)

{
  undefined4 uVar1;
  undefined4 uVar2;
  TidyDocImpl *doc;
  Lexer *pLVar3;
  Bool BVar4;
  uint firstByte;
  int iVar5;
  uint uVar6;
  uint local_30;
  int count;
  
  BVar4 = (*(in->source).eof)((in->source).sourceData);
  if (BVar4 != no) {
    return 0xffffffff;
  }
  firstByte = (*(in->source).getByte)((in->source).sourceData);
  if (firstByte == 0xffffffff) {
    return 0xffffffff;
  }
  switch(in->encoding) {
  case 4:
    count = 0;
    iVar5 = prvTidyDecodeUTF8BytesToChar(&local_30,firstByte,(ctmbstr)0x0,&in->source,&count);
    uVar6 = 0xffffffff;
    if ((count != 1 || local_30 != 0xffffffff) || iVar5 != 0) {
      uVar6 = local_30;
    }
    if (iVar5 != 0) {
      doc = in->doc;
      pLVar3 = doc->lexer;
      uVar1 = in->curcol;
      uVar2 = in->curline;
      pLVar3->lines = uVar2;
      pLVar3->columns = uVar1;
      prvTidyReportEncodingError(doc,0x24b,local_30,no);
      return 0xfffd;
    }
    return uVar6;
  case 5:
    if (firstByte == 0x1b) {
      in->state = FSM_ESC;
      return 0x1b;
    }
    switch(in->state) {
    case FSM_ESC:
      if (firstByte == 0x28) {
        in->state = FSM_ESCP;
        return 0x28;
      }
      if (firstByte == 0x24) {
        in->state = FSM_ESCD;
        return 0x24;
      }
    case FSM_ESCP:
      in->state = FSM_ASCII;
      break;
    case FSM_ESCD:
      if (firstByte == 0x28) {
        in->state = FSM_ESCDP;
        return 0x28;
      }
    case FSM_ESCDP:
      in->state = FSM_NONASCII;
      break;
    case FSM_NONASCII:
      firstByte = firstByte | 0x80;
    }
  default:
    return firstByte;
  case 9:
    iVar5 = (*(in->source).getByte)((in->source).sourceData);
    if (iVar5 == -1) {
      return 0xffffffff;
    }
    iVar5 = iVar5 << 8;
    break;
  case 0xc:
  case 0xd:
    if (firstByte < 0x80) {
      return firstByte;
    }
    if (firstByte - 0xa1 < 0x3f && in->encoding == 0xd) {
      return firstByte;
    }
  case 10:
  case 0xb:
    iVar5 = (*(in->source).getByte)((in->source).sourceData);
    if (iVar5 == -1) {
      return 0xffffffff;
    }
    firstByte = firstByte << 8;
  }
  return iVar5 + firstByte;
}

Assistant:

static uint ReadCharFromStream( StreamIn* in )
{
    uint c, n;

    if ( TY_(IsEOF)(in) )
        return EndOfStream;
    
    c = ReadByte( in );

    if (c == EndOfStream)
        return c;

#ifndef NO_NATIVE_ISO2022_SUPPORT
    /*
       A document in ISO-2022 based encoding uses some ESC sequences
       called "designator" to switch character sets. The designators
       defined and used in ISO-2022-JP are:

        "ESC" + "(" + ?     for ISO646 variants

        "ESC" + "$" + ?     and
        "ESC" + "$" + "(" + ?   for multibyte character sets

       Where ? stands for a single character used to indicate the
       character set for multibyte characters.

       Tidy handles this by preserving the escape sequence and
       setting the top bit of each byte for non-ascii chars. This
       bit is then cleared on output. The input stream keeps track
       of the state to determine when to set/clear the bit.
    */

    if (in->encoding == ISO2022)
    {
        if (c == 0x1b)  /* ESC */
        {
            in->state = FSM_ESC;
            return c;
        }

        switch (in->state)
        {
        case FSM_ESC:
            if (c == '$')
                in->state = FSM_ESCD;
            else if (c == '(')
                in->state = FSM_ESCP;
            else
                in->state = FSM_ASCII;
            break;

        case FSM_ESCD:
            if (c == '(')
                in->state = FSM_ESCDP;
            else
                in->state = FSM_NONASCII;
            break;

        case FSM_ESCDP:
            in->state = FSM_NONASCII;
            break;

        case FSM_ESCP:
            in->state = FSM_ASCII;
            break;

        case FSM_NONASCII:
            c |= 0x80;
            break;

        case FSM_ASCII:
            break;
        }

        return c;
    }
#endif /* NO_NATIVE_ISO2022_SUPPORT */

    if ( in->encoding == UTF16LE )
    {
        uint c1 = ReadByte( in );
        if ( EndOfStream == c1 )
            return EndOfStream;
        n = (c1 << 8) + c;
        return n;
    }

    if ((in->encoding == UTF16) || (in->encoding == UTF16BE)) /* UTF-16 is big-endian by default */
    {
        uint c1 = ReadByte( in );
        if ( EndOfStream == c1 )
            return EndOfStream;
        n = (c << 8) + c1;
        return n;
    }

    if ( in->encoding == UTF8 )
    {
        /* deal with UTF-8 encoded char */

        int err, count = 0;
        
        /* first byte "c" is passed in separately */
        err = TY_(DecodeUTF8BytesToChar)( &n, c, NULL, &in->source, &count );
        if (!err && (n == (uint)EndOfStream) && (count == 1)) /* EOF */
            return EndOfStream;
        else if (err)
        {
            /* set error position just before offending character */
            in->doc->lexer->lines = in->curline;
            in->doc->lexer->columns = in->curcol;

            TY_(ReportEncodingError)(in->doc, INVALID_UTF8, n, no);
            n = 0xFFFD; /* replacement char */
        }
        
        return n;
    }
    
    /*
       This section is suitable for any "multibyte" variable-width 
       character encoding in which a one-byte code is less than
       128, and the first byte of a two-byte code is greater or
       equal to 128. Note that Big5 and ShiftJIS fit into this
       kind, even though their second byte may be less than 128
    */
    if ((in->encoding == BIG5) || (in->encoding == SHIFTJIS))
    {
        if (c < 128)
            return c;
        else if ((in->encoding == SHIFTJIS) && (c >= 0xa1 && c <= 0xdf)) /* 461643 - fix suggested by Rick Cameron 14 Sep 01 */
        {
            /*
              Rick Cameron pointed out that for Shift_JIS, the values from
              0xa1 through 0xdf represent singe-byte characters
              (U+FF61 to U+FF9F - half-shift Katakana)
            */
            return c;
        }
        else
        {
            uint c1 = ReadByte( in );
            if ( EndOfStream == c1 )
                return EndOfStream;
            n = (c << 8) + c1;
            return n;
        }
    }
    else
        n = c;
        
    return n;
}